

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubsub.hpp
# Opt level: O0

void __thiscall
ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>::
subscribe(Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
          *this,Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                *s)

{
  lock_guard<std::mutex> lVar1;
  mapped_type *ppSVar2;
  mapped_type *this_00;
  size_t local_28;
  size_t id;
  lock_guard<std::mutex> l;
  Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *s_local;
  Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *this_local;
  
  l._M_device = (mutex_type *)s;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&id,&this->m);
  local_28 = Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
             ::get_id((Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                       *)l._M_device);
  lVar1 = l;
  ppSVar2 = std::
            map<unsigned_long,_ps::Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ps::Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_*>_>_>
            ::operator[](&this->subs,&local_28);
  *ppSVar2 = (mapped_type)lVar1._M_device;
  this_00 = std::
            map<unsigned_long,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
            ::operator[](&this->signals,&local_28);
  std::set<int,_std::less<int>,_std::allocator<int>_>::clear(this_00);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&id);
  return;
}

Assistant:

void subscribe(Subscriber<T>* s)
		{
			std::lock_guard<std::mutex> l{m};
			const auto id = s->get_id();
			subs[id] = s;
			signals[id].clear();
		}